

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O1

Image * __thiscall Image::nearestNeighbourInterpolation(Image *__return_storage_ptr__,Image *this)

{
  int iVar1;
  int **ppiVar2;
  int *piVar3;
  int *piVar4;
  int row;
  int col;
  int **ppiVar5;
  ulong uVar6;
  ulong uVar7;
  
  row = this->row * 2;
  col = this->col * 2;
  iVar1 = this->maxGray;
  __return_storage_ptr__->row = row;
  __return_storage_ptr__->col = col;
  __return_storage_ptr__->maxGray = iVar1;
  ppiVar5 = new_matrix<int>(row,col);
  __return_storage_ptr__->matrix = ppiVar5;
  if (0 < this->row) {
    ppiVar2 = this->matrix;
    uVar6 = 0;
    do {
      if (0 < this->col) {
        piVar3 = ppiVar2[uVar6 >> 1 & 0x7fffffff];
        piVar4 = ppiVar5[uVar6];
        uVar7 = 0;
        do {
          piVar4[uVar7] = piVar3[uVar7 >> 1 & 0x7fffffff];
          uVar7 = uVar7 + 1;
        } while (SBORROW8(uVar7,(long)this->col * 2) != (long)(uVar7 + (long)this->col * -2) < 0);
      }
      uVar6 = uVar6 + 1;
    } while (SBORROW8(uVar6,(long)this->row * 2) != (long)(uVar6 + (long)this->row * -2) < 0);
  }
  return __return_storage_ptr__;
}

Assistant:

Image Image::nearestNeighbourInterpolation()
{
    Image result = Image(2*row, 2*col, maxGray);

    for (int i = 0; i < 2*row; ++i) {
        for (int j = 0; j < 2*col; ++j) {
            result[i][j] = matrix[i/2][j/2];
        }
    }

    return result;
}